

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O3

int UpnpRenewSubscription(UpnpClient_Handle Hnd,int *TimeOut,char *SubsId)

{
  Upnp_Handle_Type UVar1;
  uint uVar2;
  UpnpString *p;
  Handle_Info **HndInfo;
  ulong uVar3;
  Handle_Info *local_30;
  
  p = UpnpString_new();
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x9ad,"Inside UpnpRenewSubscription\n");
  uVar3 = 0xffffff8c;
  if (UpnpSdkInit == 1) {
    if (p == (UpnpString *)0x0) {
      uVar3 = 0xffffff98;
    }
    else {
      uVar3 = 0xffffff9b;
      if (SubsId != (char *)0x0) {
        UpnpString_set_String(p,SubsId);
        if (TimeOut != (int *)0x0) {
          HandleReadLock((char *)0x9c4,(int)SubsId);
          HndInfo = &local_30;
          UVar1 = GetHandleInfo(Hnd,HndInfo);
          if (UVar1 == HND_CLIENT) {
            HandleUnlock((char *)0x9cd,(int)HndInfo);
            uVar2 = genaRenewSubscription(Hnd,p,TimeOut);
            uVar3 = (ulong)uVar2;
          }
          else {
            HandleUnlock((char *)0x9c9,(int)HndInfo);
            uVar3 = 0xffffff9c;
          }
        }
      }
    }
  }
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x9d5,
             "Exiting UpnpRenewSubscription, retVal=%d\n",uVar3);
  UpnpString_delete(p);
  return (int)uVar3;
}

Assistant:

int UpnpRenewSubscription(
	UpnpClient_Handle Hnd, int *TimeOut, const Upnp_SID SubsId)
{
	struct Handle_Info *SInfo = NULL;
	int retVal;
	UpnpString *SubsIdTmp = UpnpString_new();

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpRenewSubscription\n");

	if (UpnpSdkInit != 1) {
		retVal = UPNP_E_FINISH;
		goto exit_function;
	}

	if (SubsIdTmp == NULL) {
		retVal = UPNP_E_OUTOF_MEMORY;
		goto exit_function;
	}
	if (SubsId == NULL) {
		retVal = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
	UpnpString_set_String(SubsIdTmp, SubsId);

	if (TimeOut == NULL) {
		retVal = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		retVal = UPNP_E_INVALID_HANDLE;
		goto exit_function;
	}
	HandleUnlock(__FILE__, __LINE__);

	retVal = genaRenewSubscription(Hnd, SubsIdTmp, TimeOut);

exit_function:
	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpRenewSubscription, retVal=%d\n",
		retVal);

	UpnpString_delete(SubsIdTmp);

	return retVal;
}